

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

bool __thiscall QDockWidgetGroupWindow::hasVisibleDockWidgets(QDockWidgetGroupWindow *this)

{
  long lVar1;
  QList<QDockWidget_*> *__range1;
  long lVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<QDockWidget_*> QStack_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::findChildren<QDockWidget*>
            ((QList<QDockWidget_*> *)&QStack_28,(QObject *)this,(FindChildOptions)0x1);
  lVar1 = 0;
  do {
    lVar2 = lVar1;
    if (QStack_28.size << 3 == lVar2) break;
    lVar1 = lVar2 + 8;
  } while ((*(byte *)(*(long *)(*(long *)((long)QStack_28.ptr + lVar2) + 0x20) + 10) & 1) != 0);
  QArrayDataPointer<QDockWidget_*>::~QArrayDataPointer(&QStack_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return QStack_28.size << 3 != lVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QDockWidgetGroupWindow::hasVisibleDockWidgets() const
{
    const auto &children = findChildren<QDockWidget *>(Qt::FindChildrenRecursively);
    for (auto child : children) {
        // WA_WState_Visible is set on the dock widget, associated to the active tab
        // and unset on all others.
        // WA_WState_Hidden is set if the dock widgets have been explicitly hidden.
        // This is the relevant information to check (equivalent to !child->isHidden()).
        if (!child->testAttribute(Qt::WA_WState_Hidden))
            return true;
    }
    return false;
}